

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_attribute_decoders_controller.cc
# Opt level: O2

bool __thiscall
draco::SequentialAttributeDecodersController::DecodeAttributesDecoderData
          (SequentialAttributeDecodersController *this,DecoderBuffer *buffer)

{
  pointer puVar1;
  __uniq_ptr_impl<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
  _Var2;
  _Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false> _Var3;
  bool bVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint8_t decoder_type;
  byte local_49;
  _Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false> local_48;
  vector<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
  *local_40;
  DecoderBuffer *local_38;
  
  local_38 = buffer;
  bVar4 = AttributesDecoder::DecodeAttributesDecoderData(&this->super_AttributesDecoder,buffer);
  uVar11 = 0;
  if (bVar4) {
    uVar6 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
              _vptr_AttributesDecoderInterface[6])(this);
    local_40 = &this->sequential_decoders_;
    std::
    vector<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
    ::resize(local_40,(long)(int)uVar6);
    uVar10 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar10 = uVar11;
    }
    uVar9 = 0;
    do {
      uVar11 = (ulong)(uVar10 == uVar9);
      if (uVar10 == uVar9) break;
      bVar4 = DecoderBuffer::Decode<unsigned_char>(local_38,&local_49);
      if (!bVar4) {
LAB_0013f32f:
        uVar11 = 0;
        break;
      }
      (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
        _vptr_AttributesDecoderInterface[0xc])(&local_48,this,(ulong)local_49);
      _Var3._M_head_impl = local_48._M_head_impl;
      puVar1 = (this->sequential_decoders_).
               super__Vector_base<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_48._M_head_impl = (SequentialAttributeDecoder *)0x0;
      _Var2._M_t.
      super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
      .super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>._M_head_impl =
           puVar1[uVar9]._M_t.
           super___uniq_ptr_impl<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
           ._M_t;
      puVar1[uVar9]._M_t.
      super___uniq_ptr_impl<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
      ._M_t = (tuple<draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
               )_Var3._M_head_impl;
      if ((_Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
           )_Var2._M_t.
            super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
            .super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>._M_head_impl !=
          (SequentialAttributeDecoder *)0x0) {
        (**(code **)(*(long *)_Var2._M_t.
                              super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
                              .super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>.
                              _M_head_impl + 8))();
      }
      if (local_48._M_head_impl != (SequentialAttributeDecoder *)0x0) {
        (*(local_48._M_head_impl)->_vptr_SequentialAttributeDecoder[1])();
      }
      _Var2._M_t.
      super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
      .super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>._M_head_impl =
           (local_40->
           super__Vector_base<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start[uVar9]._M_t.
           super___uniq_ptr_impl<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
           ._M_t;
      if ((_Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
           )_Var2._M_t.
            super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
            .super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>._M_head_impl ==
          (SequentialAttributeDecoder *)0x0) goto LAB_0013f32f;
      iVar7 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                _vptr_AttributesDecoderInterface[7])(this);
      iVar8 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                _vptr_AttributesDecoderInterface[5])(this,uVar9 & 0xffffffff);
      cVar5 = (**(code **)(*(long *)_Var2._M_t.
                                    super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
                                    .
                                    super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>
                                    ._M_head_impl + 0x10))
                        (_Var2._M_t.
                         super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
                         .super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>.
                         _M_head_impl,iVar7,iVar8);
      uVar9 = uVar9 + 1;
    } while (cVar5 != '\0');
  }
  return SUB81(uVar11,0);
}

Assistant:

bool SequentialAttributeDecodersController::DecodeAttributesDecoderData(
    DecoderBuffer *buffer) {
  if (!AttributesDecoder::DecodeAttributesDecoderData(buffer)) {
    return false;
  }
  // Decode unique ids of all sequential encoders and create them.
  const int32_t num_attributes = GetNumAttributes();
  sequential_decoders_.resize(num_attributes);
  for (int i = 0; i < num_attributes; ++i) {
    uint8_t decoder_type;
    if (!buffer->Decode(&decoder_type)) {
      return false;
    }
    // Create the decoder from the id.
    sequential_decoders_[i] = CreateSequentialDecoder(decoder_type);
    if (!sequential_decoders_[i]) {
      return false;
    }
    if (!sequential_decoders_[i]->Init(GetDecoder(), GetAttributeId(i))) {
      return false;
    }
  }
  return true;
}